

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-kalman-filter.cpp
# Opt level: O2

double testExtendedKalmanFilterZeroInput(void)

{
  Scalar SVar1;
  result_type rVar2;
  RealScalar RVar3;
  double *pdVar4;
  Index IVar5;
  int iVar6;
  long lVar7;
  Scalar *pSVar8;
  Scalar *pSVar9;
  TimeIndex in_RCX;
  MeasureVector *pMVar10;
  ulong index;
  uint uVar11;
  StateVector xh;
  StateVector error;
  Pmatrix p;
  normal_distribution<double> g;
  StateVector x;
  StateVector dx;
  Rmatrix r;
  Qmatrix q1;
  double *local_a618;
  Index IStack_a610;
  long local_a608;
  Qmatrix q;
  InputVector u;
  Rmatrix r1;
  KalmanFunctor func;
  StateVector xk [1001];
  MeasureVector yk [1000];
  lagged_fibonacci1279 gen_;
  
  if (testExtendedKalmanFilterZeroInput()::f == '\0') {
    iVar6 = __cxa_guard_acquire(&testExtendedKalmanFilterZeroInput()::f);
    if (iVar6 != 0) {
      stateObservation::ExtendedKalmanFilter::ExtendedKalmanFilter
                ((ExtendedKalmanFilter *)testExtendedKalmanFilterZeroInput()::f,4,3);
      __cxa_atexit(stateObservation::ExtendedKalmanFilter::~ExtendedKalmanFilter,
                   testExtendedKalmanFilterZeroInput()::f,&__dso_handle);
      __cxa_guard_release(&testExtendedKalmanFilterZeroInput()::f);
    }
  }
  stateObservation::DynamicalSystemFunctorBase::DynamicalSystemFunctorBase
            (&func.super_DynamicalSystemFunctorBase);
  func._0_8_ = &PTR__KalmanFunctor_00125cd8;
  func.s_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  func.s_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  func.t_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  func.t_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  func.m_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  func.m_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  func.n_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  func.n_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  func.a_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  func.a_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  func.a_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  func.c_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  func.c_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  func.c_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  stateObservation::ObserverBase::measureVectorRandom();
  gen_.i = 0x9999999a;
  gen_._4_4_ = 0x3fb99999;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)xk,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)yk,(double *)&gen_);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            (&func.m_,(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       *)xk);
  free(yk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  stateObservation::ObserverBase::stateVectorRandom();
  gen_.i = 0x9999999a;
  gen_._4_4_ = 0x3fb99999;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)xk,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)yk,(double *)&gen_);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            (&func.s_,(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       *)xk);
  free(yk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  stateObservation::ObserverBase::stateVectorRandom();
  IVar5 = func.t_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  pdVar4 = func.t_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  func.t_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       xk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  func.t_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       xk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  xk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = pdVar4;
  xk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar5;
  free(pdVar4);
  stateObservation::ObserverBase::measureVectorRandom();
  IVar5 = func.n_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  pdVar4 = func.n_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  func.n_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       xk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  func.n_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       xk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  xk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = pdVar4;
  xk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar5;
  free(pdVar4);
  stateObservation::KalmanFilterBase::getAmatrixRandom();
  g._mean = 0.5;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)xk,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&gen_,&g._mean);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)yk,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)xk);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (&func.a_,(Matrix<double,__1,__1,_0,__1,__1> *)yk);
  free(yk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free((void *)gen_._0_8_);
  stateObservation::KalmanFilterBase::getCmatrixRandom();
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (&func.c_,(Matrix<double,__1,__1,_0,__1,__1> *)xk);
  free(xk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  stateObservation::ExtendedKalmanFilter::setFunctor
            ((DynamicalSystemFunctorBase *)testExtendedKalmanFilterZeroInput()::f);
  memset(xk,0,0x3e90);
  memset(yk,0,16000);
  stateObservation::ObserverBase::inputVectorZero();
  stateObservation::ObserverBase::stateVectorZero();
  boost::random::lagged_fibonacci_01_engine<double,_48,_1279U,_418U>::seed(&gen_);
  stateObservation::KalmanFilterBase::getRmatrixRandom();
  r.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x3f847ae147ae147b;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&g,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&q1,(double *)&r);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&r1,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&g);
  free(q1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  stateObservation::KalmanFilterBase::getQmatrixRandom();
  q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x3f847ae147ae147b;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&g,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&r,(double *)&q);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&q1,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&g);
  free(r.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)&r1;
  g = (normal_distribution<double>)
      Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&r1,
                 (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)&q);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&r,
             (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
              *)&g);
  p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)&q1;
  g = (normal_distribution<double>)
      Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&q1,
                 (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)&p);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&q,
             (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
              *)&g);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>(xk,&x);
  for (lVar7 = 1; lVar7 != 0x3e9; lVar7 = lVar7 + 1) {
    local_a608 = lVar7;
    stateObservation::ObserverBase::stateVectorZero();
    uVar11 = 0;
    while( true ) {
      lVar7 = stateObservation::ObserverBase::getStateSize();
      if (lVar7 <= (long)(ulong)uVar11) break;
      error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x0;
      xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x3ff0000000000000;
      boost::random::normal_distribution<double>::normal_distribution
                (&g,(double *)&error,(double *)&xh);
      rVar2 = boost::random::normal_distribution<double>::operator()(&g,&gen_);
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&p,
                          (ulong)uVar11);
      *pSVar8 = rVar2;
      uVar11 = uVar11 + 1;
    }
    g = (normal_distribution<double>)
        Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&q1,
                   (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&p);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&p,
               (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                *)&g);
    stateObservation::ObserverBase::measureVectorZero();
    uVar11 = 0;
    while( true ) {
      lVar7 = stateObservation::ObserverBase::getMeasureSize();
      if (lVar7 <= (long)(ulong)uVar11) break;
      xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x0;
      dx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x3ff0000000000000;
      boost::random::normal_distribution<double>::normal_distribution
                (&g,(double *)&xh,(double *)&dx);
      rVar2 = boost::random::normal_distribution<double>::operator()(&g,&gen_);
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&error,
                          (ulong)uVar11);
      *pSVar8 = rVar2;
      uVar11 = uVar11 + 1;
    }
    g = (normal_distribution<double>)
        Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&r1,
                   (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&error);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&error,
               (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                *)&g);
    testExtendedKalmanFilterZeroInput()::KalmanFunctor::stateDynamics(Eigen::
    Matrix<double,-1,1,0,-1,1>const&,Eigen::Matrix<double,_1,1,0,_1,1>_const__long_
              ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&xh,(StateVector *)&func,&x,in_RCX);
    lVar7 = local_a608;
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)&g,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&xh,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&p);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              (&x,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   *)&g);
    free(xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (xk + lVar7,&x);
    testExtendedKalmanFilterZeroInput()::KalmanFunctor::measureDynamics(Eigen::
    Matrix<double,-1,1,0,-1,1>const&,Eigen::Matrix<double,_1,1,0,_1,1>_const__long_
              ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&xh,(StateVector *)&func,&x,in_RCX);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)&g,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&xh,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&error);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              (yk + lVar7 + -1,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)&g);
    free(xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  }
  stateObservation::ObserverBase::stateVectorRandom();
  stateObservation::ZeroDelayObserver::setState
            ((Matrix *)testExtendedKalmanFilterZeroInput()::f,(long)xk);
  stateObservation::KalmanFilterBase::getPmatrixZero();
  stateObservation::KalmanFilterBase::setStateCovariance
            ((Matrix *)testExtendedKalmanFilterZeroInput()::f);
  stateObservation::KalmanFilterBase::setR((Matrix *)testExtendedKalmanFilterZeroInput()::f);
  stateObservation::KalmanFilterBase::setQ((Matrix *)testExtendedKalmanFilterZeroInput()::f);
  uVar11 = 0;
  while( true ) {
    lVar7 = stateObservation::ObserverBase::getStateSize();
    index = (ulong)uVar11;
    if (lVar7 <= (long)index) break;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&xh,index);
    SVar1 = *pSVar8;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&p,index,
                        index);
    *pSVar9 = SVar1;
    uVar11 = uVar11 + 1;
  }
  error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)&p;
  g = (normal_distribution<double>)
      Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&p,
                 (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)&error)
  ;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            (&p,(Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                 *)&g);
  stateObservation::ObserverBase::stateVectorConstant(1.0);
  local_a618 = (double *)0x3e45798ee2308c3a;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&g,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&error,(double *)&local_a618);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&dx,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&g);
  free(error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  pMVar10 = yk;
  for (lVar7 = 1; lVar7 != 0x3e9; lVar7 = lVar7 + 1) {
    stateObservation::ZeroDelayObserver::setMeasurement
              ((Matrix *)testExtendedKalmanFilterZeroInput()::f,(long)pMVar10);
    stateObservation::ExtendedKalmanFilter::getAMatrixFD((Matrix *)&g);
    stateObservation::ExtendedKalmanFilter::getCMatrixFD((Matrix *)&error);
    stateObservation::KalmanFilterBase::setA((Matrix *)testExtendedKalmanFilterZeroInput()::f);
    stateObservation::KalmanFilterBase::setC((Matrix *)testExtendedKalmanFilterZeroInput()::f);
    stateObservation::ZeroDelayObserver::getEstimatedState((long)&local_a618);
    IVar5 = xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    pdVar4 = xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = local_a618;
    xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IStack_a610
    ;
    local_a618 = pdVar4;
    IStack_a610 = IVar5;
    free(pdVar4);
    free(error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free((void *)g._mean);
    pMVar10 = pMVar10 + 1;
  }
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)&g,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&xh,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(xk + 1000));
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&error,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&g);
  RVar3 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&error);
  free(error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(dx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(r.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(q1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(r1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(u.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  lVar7 = 0x3e70;
  do {
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::~DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)
               ((long)&yk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data + lVar7));
    lVar7 = lVar7 + -0x10;
  } while (lVar7 != -0x10);
  lVar7 = 16000;
  do {
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::~DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)
               ((long)&xk[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data + lVar7));
    lVar7 = lVar7 + -0x10;
  } while (lVar7 != -0x10);
  testExtendedKalmanFilterZeroInput::KalmanFunctor::~KalmanFunctor(&func);
  return RVar3;
}

Assistant:

double testExtendedKalmanFilterZeroInput()
{
  const static stateObservation::Index kmax = 1000;

  typedef stateObservation::ExtendedKalmanFilter ekf;

  static ekf f(4, 3);

  class KalmanFunctor : public stateObservation::DynamicalSystemFunctorBase
  {

  public:
    KalmanFunctor()
    {
      m_ = f.measureVectorRandom() * 0.1;
      s_ = f.stateVectorRandom() * 0.1;
      t_ = f.stateVectorRandom();
      n_ = f.measureVectorRandom();
    }

    virtual ekf::StateVector stateDynamics(const ekf::StateVector & x,
                                           const ekf::InputVector & u,
                                           stateObservation::TimeIndex k)
    {
      (void)k; // unused
      (void)u; // unused

      ekf::StateVector xk1;
      xk1 = a_ * x + cos(10 * (x.transpose() * x)[0]) * s_ + t_;
      return xk1;
    }

    virtual ekf::MeasureVector measureDynamics(const ekf::StateVector & x,
                                               const ekf::InputVector & u,
                                               stateObservation::TimeIndex k)
    {
      (void)k; // unused
      (void)u; // unused

      ekf::MeasureVector yk;
      yk = c_ * x + cos(10 * (x.transpose() * x)[0]) * m_ + n_;
      return yk;
    }

    void setA(const ekf::Amatrix & a)
    {
      a_ = a;
    }

    void setC(const ekf::Cmatrix & c)
    {
      c_ = c;
    }

    virtual stateObservation::Index getStateSize() const
    {
      return f.getStateSize();
    }

    virtual stateObservation::Index getInputSize() const
    {
      return f.getInputSize();
    }

    virtual stateObservation::Index getMeasurementSize() const
    {
      return f.getMeasureSize();
    }

  private:
    ekf::StateVector s_;
    ekf::StateVector t_;
    ekf::MeasureVector m_;
    ekf::MeasureVector n_;

    ekf::Amatrix a_;
    ekf::Cmatrix c_;
  };

  KalmanFunctor func;

  func.setA(f.getAmatrixRandom() * 0.5);
  func.setC(f.getCmatrixRandom());

  f.setFunctor(&func);

  ekf::StateVector xk[kmax + 1];
  ekf::MeasureVector yk[kmax];
  ekf::InputVector u = f.inputVectorZero();

  ekf::StateVector x = f.stateVectorZero();

  boost::lagged_fibonacci1279 gen_;

  ekf::Rmatrix r1 = f.getRmatrixRandom() * 0.01;

  ekf::Qmatrix q1 = f.getQmatrixRandom() * 0.01;

  ekf::Rmatrix r(r1 * r1.transpose());
  ekf::Qmatrix q(q1 * q1.transpose());

  xk[0] = x;

  for(stateObservation::Index k = 1; k <= kmax; ++k)
  {
    ekf::StateVector v(f.stateVectorZero());
    for(unsigned i = 0; i < f.getStateSize(); ++i)
    {
      boost::normal_distribution<> g(0, 1);
      v[i] = g(gen_);
    }
    v = q1 * v;

    ekf::MeasureVector w(f.measureVectorZero());
    for(unsigned i = 0; i < f.getMeasureSize(); ++i)
    {
      boost::normal_distribution<> g(0, 1);
      w[i] = g(gen_);
    }
    w = r1 * w;

    x = func.stateDynamics(x, u, k - 1) + v;

    xk[k] = x;
    yk[k - 1] = func.measureDynamics(x, u, k) + w;
  }

  ekf::StateVector xh = f.stateVectorRandom();

  f.setState(xk[0], 0);

  ekf::Pmatrix p = f.getPmatrixZero();

  f.setStateCovariance(p);

  f.setR(r);
  f.setQ(q);

  for(unsigned i = 0; i < f.getStateSize(); ++i)
  {
    p(i, i) = xh[i];
  }
  p = p * p.transpose();

  ekf::StateVector dx = f.stateVectorConstant(1) * 1e-8;

  stateObservation::Index i;
  for(i = 1; i <= kmax; ++i)
  {
    f.setMeasurement(yk[i - 1], i);

    ekf::Amatrix a = f.getAMatrixFD(dx);
    ekf::Cmatrix c = f.getCMatrixFD(dx);

    f.setA(a);
    f.setC(c);
    xh = f.getEstimatedState(i);
  }

  ekf::StateVector error = xh - xk[kmax];

  return error.norm();
}